

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

void player_learn_rune(player *p,size_t i,_Bool message)

{
  rune *prVar1;
  wchar_t index;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  wchar_t local_34;
  wchar_t j_2;
  wchar_t j_1;
  wchar_t j;
  _Bool learned;
  rune *r;
  _Bool message_local;
  size_t i_local;
  player *p_local;
  
  prVar1 = rune_list + i;
  j_1._3_1_ = false;
  switch(prVar1->variety) {
  case RUNE_VAR_COMBAT:
    if (prVar1->index == 0) {
      j_1._3_1_ = p->obj_k->to_a == 0;
      if (j_1._3_1_) {
        p->obj_k->to_a = 1;
      }
    }
    else if (prVar1->index == 1) {
      j_1._3_1_ = p->obj_k->to_h == 0;
      if (j_1._3_1_) {
        p->obj_k->to_h = 1;
      }
    }
    else if ((prVar1->index == 2) && (j_1._3_1_ = p->obj_k->to_d == 0, j_1._3_1_)) {
      p->obj_k->to_d = 1;
    }
    break;
  case RUNE_VAR_MOD:
    j_1._3_1_ = p->obj_k->modifiers[prVar1->index] == 0;
    if (j_1._3_1_) {
      p->obj_k->modifiers[prVar1->index] = 1;
    }
    break;
  case RUNE_VAR_RESIST:
    j_1._3_1_ = p->obj_k->el_info[prVar1->index].res_level == 0;
    if (j_1._3_1_) {
      p->obj_k->el_info[prVar1->index].res_level = 1;
    }
    break;
  case RUNE_VAR_BRAND:
    if ((int)(uint)z_info->brand_max <= prVar1->index) {
      __assert_fail("r->index < z_info->brand_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-knowledge.c"
                    ,0x518,"void player_learn_rune(struct player *, size_t, _Bool)");
    }
    _Var2 = player_knows_brand(p,prVar1->index);
    if (!_Var2) {
      for (j_2 = L'\x01'; j_2 < (int)(uint)z_info->brand_max; j_2 = j_2 + L'\x01') {
        iVar3 = strcmp(brands[prVar1->index].name,brands[j_2].name);
        if (iVar3 == 0) {
          p->obj_k->brands[j_2] = true;
          j_1._3_1_ = true;
        }
      }
    }
    break;
  case RUNE_VAR_SLAY:
    if ((int)(uint)z_info->slay_max <= prVar1->index) {
      __assert_fail("r->index < z_info->slay_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-knowledge.c"
                    ,0x529,"void player_learn_rune(struct player *, size_t, _Bool)");
    }
    _Var2 = player_knows_slay(p,prVar1->index);
    if (!_Var2) {
      for (local_34 = L'\x01'; local_34 < (int)(uint)z_info->slay_max; local_34 = local_34 + L'\x01'
          ) {
        _Var2 = same_monsters_slain(prVar1->index,local_34);
        if (_Var2) {
          p->obj_k->slays[local_34] = true;
          j_1._3_1_ = true;
        }
      }
    }
    break;
  case RUNE_VAR_CURSE:
    index = prVar1->index;
    if ((int)(uint)z_info->curse_max <= index) {
      __assert_fail("j < z_info->curse_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-knowledge.c"
                    ,0x53c,"void player_learn_rune(struct player *, size_t, _Bool)");
    }
    _Var2 = player_knows_curse(p,index);
    j_1._3_1_ = !_Var2;
    if (j_1._3_1_) {
      p->obj_k->curses[index].power = L'\x01';
    }
    break;
  case RUNE_VAR_FLAG:
    j_1._3_1_ = flag_on_dbg(p->obj_k->flags,5,prVar1->index,"p->obj_k->flags","r->index");
    break;
  default:
    j_1._3_1_ = false;
  }
  if (j_1._3_1_ != false) {
    if (message) {
      pcVar4 = rune_name(i);
      msgt(0x80,"You have learned the rune of %s.",pcVar4);
    }
    update_player_object_knowledge(p);
  }
  return;
}

Assistant:

static void player_learn_rune(struct player *p, size_t i, bool message)
{
	struct rune *r = &rune_list[i];
	bool learned = false;

	switch (r->variety) {
		/* Combat runes */
		case RUNE_VAR_COMBAT: {
			if (r->index == COMBAT_RUNE_TO_A) {
				if (!p->obj_k->to_a) {
					p->obj_k->to_a = 1;
					learned = true;
				}
			} else if (r->index == COMBAT_RUNE_TO_H) {
				if (!p->obj_k->to_h) {
					p->obj_k->to_h = 1;
					learned = true;
				}
			} else if (r->index == COMBAT_RUNE_TO_D) {
				if (!p->obj_k->to_d) {
					p->obj_k->to_d = 1;
					learned = true;
				}
			}
			break;
		}
		/* Mod runes */
		case RUNE_VAR_MOD: {
			if (!p->obj_k->modifiers[r->index]) {
				p->obj_k->modifiers[r->index] = 1;
				learned = true;
			}
			break;
		}
		/* Element runes */
		case RUNE_VAR_RESIST: {
			if (!p->obj_k->el_info[r->index].res_level) {
				p->obj_k->el_info[r->index].res_level = 1;
				learned = true;
			}
			break;
		}
		/* Brand runes */
		case RUNE_VAR_BRAND: {
			assert(r->index < z_info->brand_max);

			/* If the brand was unknown, add it to known brands */
			if (!player_knows_brand(p, r->index)) {
				int j;
				for (j = 1; j < z_info->brand_max; j++) {
					/* Check base and race flag */
					if (streq(brands[r->index].name, brands[j].name)) {
						p->obj_k->brands[j] = true;
						learned = true;
					}
				}
			}
			break;
		}
		/* Slay runes */
		case RUNE_VAR_SLAY: {
			assert(r->index < z_info->slay_max);

			/* If the slay was unknown, add it to known slays */
			if (!player_knows_slay(p, r->index)) {
				int j;
				for (j = 1; j < z_info->slay_max; j++) {
					/* Check base and race flag */
					if (same_monsters_slain(r->index, j)) {
						p->obj_k->slays[j] = true;
						learned = true;
					}
				}
			}
			break;
		}

		/* Curse runes */
		case RUNE_VAR_CURSE: {
			int j = r->index;
			assert(j < z_info->curse_max);

			/* If the curse was unknown, add it to known curses */
			if (!player_knows_curse(p, j)) {
				p->obj_k->curses[j].power = 1;
				learned = true;
			}
			break;
		}
		/* Flag runes */
		case RUNE_VAR_FLAG: {
			if (of_on(p->obj_k->flags, r->index))
				learned = true;
			break;
		}
		default: {
			learned = false;
			break;
		}
	}

	/* Nothing learned */
	if (!learned) return;

	/* Give a message */
	if (message)
		msgt(MSG_RUNE, "You have learned the rune of %s.", rune_name(i));

	/* Update knowledge */
	update_player_object_knowledge(p);
}